

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdcapi_psbt.cpp
# Opt level: O0

int CfdSetPsbtSignature(void *handle,void *psbt_handle,char *txid,uint32_t vout,char *pubkey,
                       char *der_signature)

{
  bool bVar1;
  undefined8 uVar2;
  uint32_t in_ECX;
  char *in_RDX;
  long in_RSI;
  char *in_R8;
  Psbt *in_R9;
  CfdException *except;
  exception *std_except;
  KeyData key;
  OutPoint outpoint;
  CfdCapiPsbtHandle *psbt_obj;
  int result;
  ByteData *in_stack_fffffffffffffb48;
  KeyData *in_stack_fffffffffffffb50;
  OutPoint *outpoint_00;
  string *in_stack_fffffffffffffb60;
  undefined8 in_stack_fffffffffffffb68;
  CfdError error_code;
  allocator *paVar3;
  CfdException *in_stack_fffffffffffffb70;
  allocator local_3f1;
  string local_3f0;
  ByteData local_3d0;
  string *in_stack_fffffffffffffc58;
  void *in_stack_fffffffffffffc60;
  allocator local_379;
  string local_378;
  Pubkey local_358;
  KeyData local_340;
  allocator local_1e9;
  string local_1e8;
  Txid local_1c8;
  OutPoint local_1a8;
  undefined1 local_17a;
  allocator local_179;
  string local_178 [32];
  CfdSourceLocation local_158;
  undefined1 local_13a;
  allocator local_139;
  string local_138 [32];
  CfdSourceLocation local_118;
  undefined1 local_fa;
  allocator local_f9;
  string local_f8 [32];
  CfdSourceLocation local_d8;
  undefined1 local_ba;
  allocator local_b9;
  string local_b8 [32];
  CfdSourceLocation local_98;
  long local_80;
  allocator local_71;
  string local_70 [52];
  undefined4 local_3c;
  Psbt *local_38;
  char *local_30;
  uint32_t local_24;
  char *local_20;
  long local_18;
  int local_4;
  
  error_code = (CfdError)((ulong)in_stack_fffffffffffffb68 >> 0x20);
  local_3c = 0xffffffff;
  local_38 = in_R9;
  local_30 = in_R8;
  local_24 = in_ECX;
  local_20 = in_RDX;
  local_18 = in_RSI;
  cfd::Initialize();
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_70,"PsbtHandle",&local_71);
  cfd::capi::CheckBuffer(in_stack_fffffffffffffc60,in_stack_fffffffffffffc58);
  std::__cxx11::string::~string(local_70);
  std::allocator<char>::~allocator((allocator<char> *)&local_71);
  local_80 = local_18;
  bVar1 = cfd::capi::IsEmptyString(local_20);
  if (bVar1) {
    local_98.filename =
         strrchr("//workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/src/capi/cfdcapi_psbt.cpp"
                 ,0x2f);
    local_98.filename = local_98.filename + 1;
    local_98.line = 0x38b;
    local_98.funcname = "CfdSetPsbtSignature";
    cfd::core::logger::warn<>(&local_98,"txid is null or empty.");
    local_ba = 1;
    uVar2 = __cxa_allocate_exception(0x30);
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_b8,"Failed to parameter. txid is null or empty.",&local_b9);
    cfd::core::CfdException::CfdException
              (in_stack_fffffffffffffb70,error_code,in_stack_fffffffffffffb60);
    local_ba = 0;
    __cxa_throw(uVar2,&cfd::core::CfdException::typeinfo,cfd::core::CfdException::~CfdException);
  }
  bVar1 = cfd::capi::IsEmptyString(local_30);
  if (bVar1) {
    local_d8.filename =
         strrchr("//workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/src/capi/cfdcapi_psbt.cpp"
                 ,0x2f);
    local_d8.filename = local_d8.filename + 1;
    local_d8.line = 0x391;
    local_d8.funcname = "CfdSetPsbtSignature";
    cfd::core::logger::warn<>(&local_d8,"pubkey is null or empty.");
    local_fa = 1;
    uVar2 = __cxa_allocate_exception(0x30);
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_f8,"Failed to parameter. pubkey is null or empty.",&local_f9)
    ;
    cfd::core::CfdException::CfdException
              (in_stack_fffffffffffffb70,error_code,in_stack_fffffffffffffb60);
    local_fa = 0;
    __cxa_throw(uVar2,&cfd::core::CfdException::typeinfo,cfd::core::CfdException::~CfdException);
  }
  bVar1 = cfd::capi::IsEmptyString((char *)local_38);
  if (bVar1) {
    local_118.filename =
         strrchr("//workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/src/capi/cfdcapi_psbt.cpp"
                 ,0x2f);
    local_118.filename = local_118.filename + 1;
    local_118.line = 0x397;
    local_118.funcname = "CfdSetPsbtSignature";
    cfd::core::logger::warn<>(&local_118,"der_signature is null or empty.");
    local_13a = 1;
    uVar2 = __cxa_allocate_exception(0x30);
    std::allocator<char>::allocator();
    std::__cxx11::string::string
              (local_138,"Failed to parameter. der_signature is null or empty.",&local_139);
    cfd::core::CfdException::CfdException
              (in_stack_fffffffffffffb70,error_code,in_stack_fffffffffffffb60);
    local_13a = 0;
    __cxa_throw(uVar2,&cfd::core::CfdException::typeinfo,cfd::core::CfdException::~CfdException);
  }
  if (*(long *)(local_80 + 0x18) == 0) {
    local_158.filename =
         strrchr("//workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/src/capi/cfdcapi_psbt.cpp"
                 ,0x2f);
    local_158.filename = local_158.filename + 1;
    local_158.line = 0x39d;
    local_158.funcname = "CfdSetPsbtSignature";
    cfd::core::logger::warn<>(&local_158,"psbt is null.");
    local_17a = 1;
    uVar2 = __cxa_allocate_exception(0x30);
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_178,"Failed to handle statement. psbt is null.",&local_179);
    cfd::core::CfdException::CfdException
              (in_stack_fffffffffffffb70,error_code,in_stack_fffffffffffffb60);
    local_17a = 0;
    __cxa_throw(uVar2,&cfd::core::CfdException::typeinfo,cfd::core::CfdException::~CfdException);
  }
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_1e8,local_20,&local_1e9);
  cfd::core::Txid::Txid(&local_1c8,&local_1e8);
  cfd::core::OutPoint::OutPoint(&local_1a8,&local_1c8,local_24);
  cfd::core::Txid::~Txid((Txid *)0x5ef06d);
  std::__cxx11::string::~string((string *)&local_1e8);
  std::allocator<char>::~allocator((allocator<char> *)&local_1e9);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_378,local_30,&local_379);
  cfd::core::Pubkey::Pubkey(&local_358,&local_378);
  std::__cxx11::string::string((string *)&stack0xfffffffffffffc60);
  cfd::core::ByteData::ByteData((ByteData *)&stack0xfffffffffffffc48);
  cfd::core::KeyData::KeyData
            (&local_340,&local_358,(string *)&stack0xfffffffffffffc60,
             (ByteData *)&stack0xfffffffffffffc48);
  cfd::core::ByteData::~ByteData((ByteData *)0x5ef126);
  std::__cxx11::string::~string((string *)&stack0xfffffffffffffc60);
  cfd::core::Pubkey::~Pubkey((Pubkey *)0x5ef140);
  std::__cxx11::string::~string((string *)&local_378);
  std::allocator<char>::~allocator((allocator<char> *)&local_379);
  outpoint_00 = *(OutPoint **)(local_80 + 0x18);
  paVar3 = &local_3f1;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_3f0,(char *)local_38,paVar3);
  cfd::core::ByteData::ByteData(&local_3d0,&local_3f0);
  cfd::Psbt::SetTxInSignature
            (local_38,outpoint_00,in_stack_fffffffffffffb50,in_stack_fffffffffffffb48);
  cfd::core::ByteData::~ByteData((ByteData *)0x5ef1eb);
  std::__cxx11::string::~string((string *)&local_3f0);
  std::allocator<char>::~allocator((allocator<char> *)&local_3f1);
  local_4 = 0;
  cfd::core::KeyData::~KeyData(in_stack_fffffffffffffb50);
  cfd::core::OutPoint::~OutPoint((OutPoint *)0x5ef22a);
  return local_4;
}

Assistant:

int CfdSetPsbtSignature(
    void* handle, void* psbt_handle, const char* txid, uint32_t vout,
    const char* pubkey, const char* der_signature) {
  int result = CfdErrorCode::kCfdUnknownError;
  try {
    cfd::Initialize();
    CheckBuffer(psbt_handle, kPrefixPsbtHandle);
    CfdCapiPsbtHandle* psbt_obj = static_cast<CfdCapiPsbtHandle*>(psbt_handle);
    if (IsEmptyString(txid)) {
      warn(CFD_LOG_SOURCE, "txid is null or empty.");
      throw CfdException(
          CfdError::kCfdIllegalArgumentError,
          "Failed to parameter. txid is null or empty.");
    }
    if (IsEmptyString(pubkey)) {
      warn(CFD_LOG_SOURCE, "pubkey is null or empty.");
      throw CfdException(
          CfdError::kCfdIllegalArgumentError,
          "Failed to parameter. pubkey is null or empty.");
    }
    if (IsEmptyString(der_signature)) {
      warn(CFD_LOG_SOURCE, "der_signature is null or empty.");
      throw CfdException(
          CfdError::kCfdIllegalArgumentError,
          "Failed to parameter. der_signature is null or empty.");
    }
    if (psbt_obj->psbt == nullptr) {
      warn(CFD_LOG_SOURCE, "psbt is null.");
      throw CfdException(
          CfdError::kCfdIllegalStateError,
          "Failed to handle statement. psbt is null.");
    }
    OutPoint outpoint(Txid(txid), vout);

    KeyData key = KeyData(Pubkey(pubkey), std::string(), ByteData());
    psbt_obj->psbt->SetTxInSignature(outpoint, key, ByteData(der_signature));
    return CfdErrorCode::kCfdSuccess;
  } catch (const CfdException& except) {
    result = SetLastError(handle, except);
  } catch (const std::exception& std_except) {
    SetLastFatalError(handle, std_except.what());
  } catch (...) {
    SetLastFatalError(handle, "unknown error.");
  }
  return result;
}